

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenStructBody
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  StructDef *struct_def_00;
  char *pcVar1;
  bool bVar2;
  reference ppFVar3;
  char *pcVar4;
  Type *type;
  allocator<char> local_2c9;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  char *local_1d8;
  char *suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  string local_188;
  string local_168;
  allocator<char> local_141;
  string local_140;
  FieldDef *local_120;
  FieldDef *field;
  undefined1 local_110 [8];
  reverse_iterator it;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *nameprefix_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  local_28 = nameprefix;
  nameprefix_local = (char *)writer;
  writer_local = (CodeWriter *)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"align",&local_49);
  NumToString<unsigned_long>(&local_80,*(unsigned_long *)&writer_local->field_0x118);
  CodeWriter::SetValue(writer,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar4 = nameprefix_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"size",&local_a1);
  NumToString<unsigned_long>(&local_c8,*(unsigned_long *)&writer_local->field_0x120);
  CodeWriter::SetValue((CodeWriter *)pcVar4,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"builder.prep({{align}}, {{size}})",
             (allocator<char> *)
             ((long)&fields_vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  CodeWriter::operator+=((CodeWriter *)nameprefix_local,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fields_vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it,
             (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
             &writer_local->field_0xf8);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_110)
  ;
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_110,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar2) break;
    ppFVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_110);
    pcVar4 = nameprefix_local;
    local_120 = *ppFVar3;
    if (local_120->padding != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"pad",&local_141);
      NumToString<unsigned_long>(&local_168,local_120->padding);
      CodeWriter::SetValue((CodeWriter *)pcVar4,&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"builder.pad({{pad}})",&local_189);
      CodeWriter::operator+=((CodeWriter *)nameprefix_local,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    bVar2 = IsStruct(&(local_120->value).type);
    pcVar1 = nameprefix_local;
    pcVar4 = local_28;
    if (bVar2) {
      struct_def_00 = (local_120->value).type.struct_def;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&suffix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "_");
      std::operator+(&local_1b0,pcVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&suffix);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      GenStructBody(this,struct_def_00,(CodeWriter *)pcVar1,pcVar4);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&suffix);
    }
    else {
      bVar2 = IsEnum(&(local_120->value).type);
      pcVar4 = nameprefix_local;
      local_1d8 = "";
      if (bVar2) {
        local_1d8 = ".value";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"type",&local_1f9);
      GenMethod_abi_cxx11_(&local_220,(KotlinKMPGenerator *)&local_120->value,type);
      CodeWriter::SetValue((CodeWriter *)pcVar4,&local_1f8,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      pcVar1 = nameprefix_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"argname",&local_241);
      pcVar4 = local_28;
      IdlNamer::Variable_abi_cxx11_(&local_2a8,&this->namer_,local_120);
      std::operator+(&local_288,pcVar4,&local_2a8);
      std::operator+(&local_268,&local_288,local_1d8);
      CodeWriter::SetValue((CodeWriter *)pcVar1,&local_240,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"builder.put{{type}}({{argname}})",&local_2c9);
      CodeWriter::operator+=((CodeWriter *)nameprefix_local,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_110);
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it);
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        auto suffix = IsEnum(field.value.type) ? ".value" : "";
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname",
                        nameprefix + namer_.Variable(field) + suffix);
        writer += "builder.put{{type}}({{argname}})";
      }
    }
  }